

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::anon_unknown_0::decodeISE
               (ISEDecodedResult *dst,int numValues,BitAccessStream *data,ISEParams *params)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  uint uVar4;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 *pdVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  deUint32 local_78 [4];
  deUint32 local_68;
  ulong local_58;
  BitAccessStream *local_50;
  ISEParams *local_48;
  ulong local_40;
  ulong local_38;
  uint uVar5;
  
  local_50 = data;
  local_48 = params;
  if (params->mode == ISEMODE_TRIT) {
    uVar5 = (uint)(0x33333332 < numValues * -0x33333333 + 0x19999999U);
    uVar4 = uVar5 + numValues / 5;
    if (uVar4 != 0 && SCARRY4(uVar5,numValues / 5) == (int)uVar4 < 0) {
      local_38 = (ulong)(uVar4 - 1);
      local_40 = (ulong)uVar4;
      uVar12 = 0;
      do {
        uVar5 = 5;
        if (uVar12 == local_38) {
          uVar5 = numValues + (uVar4 - 1) * -5;
        }
        iVar1 = local_48->numBits;
        local_78[0] = BitAccessStream::getNext(data,iVar1);
        dVar6 = BitAccessStream::getNext(data,2);
        local_58 = CONCAT44(local_58._4_4_,dVar6);
        local_78[1] = BitAccessStream::getNext(data,iVar1);
        dVar6 = BitAccessStream::getNext(data,2);
        local_78[2] = BitAccessStream::getNext(data,iVar1);
        dVar7 = BitAccessStream::getNext(data,1);
        local_78[3] = BitAccessStream::getNext(data,iVar1);
        dVar8 = BitAccessStream::getNext(data,2);
        local_68 = BitAccessStream::getNext(data,iVar1);
        dVar9 = BitAccessStream::getNext(data,1);
        switch(uVar5) {
        case 1:
          dVar8 = 0;
          dVar9 = 0;
          dVar7 = 0;
          dVar6 = 0;
          break;
        case 2:
          dVar8 = 0;
          dVar9 = 0;
          dVar7 = 0;
          break;
        case 3:
          dVar8 = 0;
        case 4:
          dVar9 = 0;
        }
        if (0 < (int)uVar5) {
          pdVar10 = &dst[(long)((uVar12 << 0x20) * 5) >> 0x20].v;
          uVar11 = 0;
          do {
            dVar2 = local_78[uVar11];
            ((ISEDecodedResult *)(pdVar10 + -2))->m = dVar2;
            dVar3 = *(deUint32 *)
                     (astc::(anonymous_namespace)::
                      decodeISETritBlock(tcu::astc::(anonymous_namespace)::ISEDecodedResult*,int,tcu::astc::(anonymous_namespace)::BitAccessStream&,int)
                      ::tritsFromT +
                     (ulong)(dVar8 << 5 | (uint)local_58 | dVar7 << 4 | dVar9 << 7 | dVar6 << 2) *
                     0x14 + uVar11 * 4);
            pdVar10[-1] = dVar3;
            *pdVar10 = (dVar3 << ((byte)iVar1 & 0x1f)) + dVar2;
            uVar11 = uVar11 + 1;
            pdVar10 = pdVar10 + 3;
          } while (uVar5 != uVar11);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_40);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    uVar5 = (uint)(0x55555554 < numValues * -0x55555555 + 0x2aaaaaaaU);
    uVar4 = uVar5 + numValues / 3;
    if (uVar4 != 0 && SCARRY4(uVar5,numValues / 3) == (int)uVar4 < 0) {
      local_58 = (ulong)(uVar4 - 1);
      uVar12 = 0;
      do {
        uVar5 = 3;
        if (uVar12 == local_58) {
          uVar5 = numValues + (uVar4 - 1) * -3;
        }
        iVar1 = local_48->numBits;
        local_78[0] = BitAccessStream::getNext(data,iVar1);
        dVar6 = BitAccessStream::getNext(data,3);
        local_78[1] = BitAccessStream::getNext(data,iVar1);
        dVar7 = BitAccessStream::getNext(data,2);
        local_78[2] = BitAccessStream::getNext(data,iVar1);
        dVar8 = BitAccessStream::getNext(data,2);
        if (uVar5 == 2) {
          dVar8 = 0;
        }
        else if (uVar5 == 1) {
          dVar8 = 0;
          dVar7 = 0;
        }
        if (0 < (int)uVar5) {
          pdVar10 = &dst[(long)((uVar12 << 0x20) * 3) >> 0x20].v;
          uVar11 = 0;
          do {
            dVar9 = local_78[uVar11];
            ((ISEDecodedResult *)(pdVar10 + -2))->m = dVar9;
            dVar2 = *(deUint32 *)
                     (astc::(anonymous_namespace)::
                      decodeISEQuintBlock(tcu::astc::(anonymous_namespace)::ISEDecodedResult*,int,tcu::astc::(anonymous_namespace)::BitAccessStream&,int)
                      ::quintsFromQ + (ulong)(dVar8 << 5 | dVar6 | dVar7 << 3) * 0xc + uVar11 * 4);
            pdVar10[-1] = dVar2;
            *pdVar10 = (dVar2 << ((byte)iVar1 & 0x1f)) + dVar9;
            uVar11 = uVar11 + 1;
            pdVar10 = pdVar10 + 3;
          } while (uVar5 != uVar11);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar4);
    }
  }
  else if (0 < numValues) {
    lVar13 = 0;
    do {
      dVar6 = BitAccessStream::getNext(local_50,local_48->numBits);
      *(deUint32 *)((long)&dst->m + lVar13) = dVar6;
      *(deUint32 *)((long)&dst->v + lVar13) = dVar6;
      lVar13 = lVar13 + 0xc;
    } while ((ulong)(uint)numValues * 0xc != lVar13);
  }
  return;
}

Assistant:

void decodeISE (ISEDecodedResult* dst, int numValues, BitAccessStream& data, const ISEParams& params)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			decodeISETritBlock(&dst[5*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			decodeISEQuintBlock(&dst[3*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			decodeISEBitBlock(&dst[i], data, params.numBits);
	}
}